

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_datagram_socket.hpp
# Opt level: O1

size_t __thiscall
asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::send_to<asio::const_buffers_1>
          (basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *this,
          const_buffers_1 *buffers,endpoint_type *destination)

{
  size_t sVar1;
  error_code __ec;
  error_code ec;
  system_error local_40 [32];
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = 0x1c;
  if ((destination->impl_).data_.base.sa_family == 2) {
    sVar1 = 0x10;
  }
  sVar1 = asio::detail::socket_ops::sync_sendto1
                    ((this->super_basic_socket<asio::ip::udp,_asio::any_io_executor>).impl_.
                     implementation_.super_base_implementation_type.socket_,
                     (this->super_basic_socket<asio::ip::udp,_asio::any_io_executor>).impl_.
                     implementation_.super_base_implementation_type.state_,
                     (buffers->super_const_buffer).data_,(buffers->super_const_buffer).size_,0,
                     destination,sVar1,&ec);
  __ec._4_4_ = 0;
  __ec._M_value = ec._M_value;
  if (ec._M_value != 0) {
    __ec._M_cat = ec._M_cat;
    std::system_error::system_error(local_40,__ec,"send_to");
    asio::detail::throw_exception<std::system_error>(local_40);
    std::system_error::~system_error(local_40);
  }
  return sVar1;
}

Assistant:

std::size_t send_to(const ConstBufferSequence& buffers,
      const endpoint_type& destination)
  {
    asio::error_code ec;
    std::size_t s = this->impl_.get_service().send_to(
        this->impl_.get_implementation(), buffers, destination, 0, ec);
    asio::detail::throw_error(ec, "send_to");
    return s;
  }